

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  FieldDescriptor *pFVar3;
  slot_type *psVar4;
  reference ppVar5;
  undefined8 in_RCX;
  code *args;
  slot_type *psVar6;
  FieldDescriptor **key;
  slot_type *in_R8;
  undefined7 uVar7;
  tuple<std::nullptr_t_&&> *in_R9;
  bool bVar8;
  
  psVar1 = (slot_type *)a->ctrl_;
  args = (code *)CONCAT71((int7)((ulong)in_RCX >> 8),psVar1 == (slot_type *)0x0);
  if ((psVar1 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(piecewise_construct_t *)psVar1)) {
    args = (code *)b->ctrl_;
    bVar8 = (slot_type *)args == (slot_type *)0x0;
    in_R8 = (slot_type *)CONCAT71((int7)((ulong)in_R8 >> 8),bVar8);
    in_R9 = (tuple<std::nullptr_t_&&> *)
            CONCAT71((int7)((ulong)in_R9 >> 8),
                     args == absl::lts_20240722::str_format_internal::FormatArgImpl::
                             Dispatch<double> || bVar8);
    if ((args != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> && !bVar8)
       && ((char)*args < '\0')) goto LAB_0030fcc6;
    in_R9 = (tuple<std::nullptr_t_&&> *)((ulong)psVar1 ^ 0x4e07b0 | (ulong)args ^ 0x4e07b0);
    if (in_R9 == (tuple<std::nullptr_t_&&> *)0x0) {
LAB_0030fcb9:
      return psVar1 == (slot_type *)args;
    }
    uVar7 = (undefined7)(((ulong)args ^ 0x4e07b0) >> 8);
    in_R8 = (slot_type *)
            CONCAT71(uVar7,args == absl::lts_20240722::str_format_internal::FormatArgImpl::
                                   Dispatch<double>);
    if ((psVar1 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
        (args == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
    goto LAB_0030fccb;
    if (psVar1 == (slot_type *)0x0 || (slot_type *)args == (slot_type *)0x0) goto LAB_0030fcb9;
    in_R8 = (slot_type *)CONCAT71(uVar7,psVar1 == (slot_type *)&kSooControl);
    if (((slot_type *)args == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar2 = (b->field_1).slot_;
      if (psVar1 == (slot_type *)&kSooControl) {
        bVar8 = (slot_type *)a == psVar2;
      }
      else {
        psVar6 = psVar2;
        psVar4 = (slot_type *)args;
        in_R8 = (slot_type *)a;
        if (args < psVar1) {
          psVar6 = (slot_type *)a;
          psVar4 = psVar1;
          in_R8 = psVar2;
        }
        b = (iterator *)CONCAT71((int7)((ulong)psVar4 >> 8),psVar4 < in_R8);
        bVar8 = in_R8 <= psVar6 && psVar4 < in_R8;
      }
      if (bVar8) goto LAB_0030fcb9;
    }
  }
  else {
    operator==();
LAB_0030fcc6:
    operator==();
LAB_0030fccb:
    operator==();
  }
  operator==();
  pFVar3 = ((value_type *)a)->first;
  if (pFVar3 == (FieldDescriptor *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
    ::iterator::operator->((iterator *)a);
  }
  else {
    args = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    if (pFVar3 != (FieldDescriptor *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
      if (-1 < (char)(pFVar3->super_SymbolBase).symbol_type_) {
        ppVar5 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
                 ::iterator::operator*(a);
        return SUB81(ppVar5,0);
      }
      goto LAB_0030fd04;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
  ::iterator::operator->((iterator *)a);
LAB_0030fd04:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>>>>
  ::iterator::operator->((iterator *)a);
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
  ::find_or_prepare_insert<google::protobuf::FieldDescriptor_const*>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>::iterator,_bool>
              *)a,(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
                   *)b->ctrl_,key);
  if (*(char *)&(((value_type *)a)->second).
                super__Vector_base<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::FieldDescriptor_const*&>,std::tuple<decltype(nullptr)&&>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
                *)b->ctrl_,*(iterator *)a,(piecewise_construct_t *)args,
               (tuple<const_google::protobuf::FieldDescriptor_*&> *)&in_R8->value,in_R9);
  }
  return SUB81(a,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }